

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

TOperator __thiscall
glslang::HlslParseContext::mapAtomicOp
          (HlslParseContext *this,TSourceLoc *loc,TOperator op,bool isImage)

{
  bool isImage_local;
  TOperator op_local;
  TSourceLoc *loc_local;
  HlslParseContext *this_local;
  
  switch(op) {
  case EOpInterlockedAdd:
    this_local._4_4_ = EOpAtomicAdd;
    if (isImage) {
      this_local._4_4_ = EOpImageAtomicAdd;
    }
    break;
  case EOpInterlockedAnd:
    this_local._4_4_ = EOpAtomicAnd;
    if (isImage) {
      this_local._4_4_ = EOpImageAtomicAnd;
    }
    break;
  case EOpInterlockedCompareExchange:
    this_local._4_4_ = EOpAtomicCompSwap;
    if (isImage) {
      this_local._4_4_ = EOpImageAtomicCompSwap;
    }
    break;
  case EOpInterlockedCompareStore:
  default:
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"unknown atomic operation","unknown op","");
    this_local._4_4_ = EOpNull;
    break;
  case EOpInterlockedExchange:
    this_local._4_4_ = EOpAtomicExchange;
    if (isImage) {
      this_local._4_4_ = EOpImageAtomicExchange;
    }
    break;
  case EOpInterlockedMax:
    this_local._4_4_ = EOpAtomicMax;
    if (isImage) {
      this_local._4_4_ = EOpImageAtomicMax;
    }
    break;
  case EOpInterlockedMin:
    this_local._4_4_ = EOpAtomicMin;
    if (isImage) {
      this_local._4_4_ = EOpImageAtomicMin;
    }
    break;
  case EOpInterlockedOr:
    this_local._4_4_ = EOpAtomicOr;
    if (isImage) {
      this_local._4_4_ = EOpImageAtomicOr;
    }
    break;
  case EOpInterlockedXor:
    this_local._4_4_ = EOpAtomicXor;
    if (isImage) {
      this_local._4_4_ = EOpImageAtomicXor;
    }
  }
  return this_local._4_4_;
}

Assistant:

TOperator HlslParseContext::mapAtomicOp(const TSourceLoc& loc, TOperator op, bool isImage)
{
    switch (op) {
    case EOpInterlockedAdd:             return isImage ? EOpImageAtomicAdd      : EOpAtomicAdd;
    case EOpInterlockedAnd:             return isImage ? EOpImageAtomicAnd      : EOpAtomicAnd;
    case EOpInterlockedCompareExchange: return isImage ? EOpImageAtomicCompSwap : EOpAtomicCompSwap;
    case EOpInterlockedMax:             return isImage ? EOpImageAtomicMax      : EOpAtomicMax;
    case EOpInterlockedMin:             return isImage ? EOpImageAtomicMin      : EOpAtomicMin;
    case EOpInterlockedOr:              return isImage ? EOpImageAtomicOr       : EOpAtomicOr;
    case EOpInterlockedXor:             return isImage ? EOpImageAtomicXor      : EOpAtomicXor;
    case EOpInterlockedExchange:        return isImage ? EOpImageAtomicExchange : EOpAtomicExchange;
    case EOpInterlockedCompareStore:  // TODO: ...
    default:
        error(loc, "unknown atomic operation", "unknown op", "");
        return EOpNull;
    }
}